

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeRowid(sqlite3_vtab_cursor *pVtabCursor,sqlite_int64 *pRowid)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  RtreeNode *pRVar4;
  i64 iVar5;
  sqlite3_vtab *psVar6;
  long in_FS_OFFSET;
  int rc;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)((long)&pVtabCursor[1].pVtab + 1) == '\0') {
    if (*(int *)((long)&pVtabCursor[4].pVtab + 4) == 0) {
      psVar6 = (sqlite3_vtab *)0x0;
    }
    else {
      psVar6 = pVtabCursor[6].pVtab;
    }
  }
  else {
    psVar6 = (sqlite3_vtab *)(pVtabCursor + 8);
  }
  local_2c = 0;
  pRVar4 = rtreeNodeOfFirstSearchPoint((RtreeCursor *)pVtabCursor,&local_2c);
  iVar3 = local_2c;
  if (psVar6 != (sqlite3_vtab *)0x0 && local_2c == 0) {
    uVar2 = *(ushort *)(pRVar4->zData + 2);
    bVar1 = *(byte *)((long)&psVar6->zErrMsg + 2);
    iVar3 = 4;
    if ((ushort)bVar1 < (ushort)(uVar2 << 8 | uVar2 >> 8)) {
      iVar5 = readInt64(pRVar4->zData +
                        (ulong)((uint)(byte)pVtabCursor->pVtab[1].field_0xf * (uint)bVar1) + 4);
      *pRowid = iVar5;
      iVar3 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int rtreeRowid(sqlite3_vtab_cursor *pVtabCursor, sqlite_int64 *pRowid){
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);
  if( rc==SQLITE_OK && ALWAYS(p) ){
    if( p->iCell>=NCELL(pNode) ){
      rc = SQLITE_ABORT;
    }else{
      *pRowid = nodeGetRowid(RTREE_OF_CURSOR(pCsr), pNode, p->iCell);
    }
  }
  return rc;
}